

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLLinOp.cpp
# Opt level: O0

MPI_Comm __thiscall amrex::MLLinOp::makeSubCommunicator(MLLinOp *this,DistributionMapping *dm)

{
  DistributionMapping *dm_local;
  MLLinOp *this_local;
  
  return this->m_default_comm;
}

Assistant:

MPI_Comm
MLLinOp::makeSubCommunicator (const DistributionMapping& dm)
{
    BL_PROFILE("MLLinOp::makeSubCommunicator()");

#ifdef BL_USE_MPI

    Vector<int> newgrp_ranks = dm.ProcessorMap();
    std::sort(newgrp_ranks.begin(), newgrp_ranks.end());
    auto last = std::unique(newgrp_ranks.begin(), newgrp_ranks.end());
    newgrp_ranks.erase(last, newgrp_ranks.end());

    if (flag_verbose_linop) {
        Print() << "MLLinOp::makeSubCommunicator(): called for " << newgrp_ranks.size() << " ranks" << std::endl;
    }

    MPI_Comm newcomm;
    bool cache_hit = false;
    uint64_t key = 0;
    if (flag_comm_cache) {
        AMREX_ASSERT(comm_cache);
        key = hash_vector(newgrp_ranks, hash_vector(get_subgroup_ranks()));
        cache_hit = comm_cache->get(key, newcomm);
        if (cache_hit && flag_verbose_linop) {
            Print() << "MLLinOp::makeSubCommunicator(): found subcomm in cache" << std::endl;
        }
    }

    if (!flag_comm_cache || !cache_hit) {
        MPI_Group defgrp, newgrp;
        MPI_Comm_group(m_default_comm, &defgrp);
        if (ParallelContext::CommunicatorSub() == ParallelDescriptor::Communicator()) {
            MPI_Group_incl(defgrp, newgrp_ranks.size(), newgrp_ranks.data(), &newgrp);
        } else {
            Vector<int> local_newgrp_ranks(newgrp_ranks.size());
            ParallelContext::global_to_local_rank(local_newgrp_ranks.data(),
                                                  newgrp_ranks.data(), newgrp_ranks.size());
            MPI_Group_incl(defgrp, local_newgrp_ranks.size(), local_newgrp_ranks.data(), &newgrp);
        }

        if (flag_verbose_linop) {
            Print() << "MLLinOp::makeSubCommunicator(): MPI_Comm_create: (";
            for (auto rank : newgrp_ranks) {
                Print() << rank << ",";
            }
            Print() << "\b)" << std::endl;
        }

        MPI_Comm_create(m_default_comm, newgrp, &newcomm);

        if (flag_comm_cache) {
            comm_cache->add(key, newcomm);
        } else {
            m_raii_comm = std::make_unique<CommContainer>(newcomm);
        }

        MPI_Group_free(&defgrp);
        MPI_Group_free(&newgrp);
    }

    return newcomm;
#else
    amrex::ignore_unused(dm);
    return m_default_comm;
#endif
}